

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O3

void __thiscall UDPServer::on_output(UDPServer *this,Poll *p)

{
  _Elt_pointer ppVar1;
  pointer pcVar2;
  size_t sVar3;
  ostream *poVar4;
  value_type msg;
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60;
  size_t local_58;
  long local_50 [2];
  sockaddr local_40;
  
  ppVar1 = (this->msg_queue).c.
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->msg_queue).c.
      super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar1) {
    pcVar2 = (ppVar1->first)._M_dataplus._M_p;
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + (ppVar1->first)._M_string_length);
    local_40._0_8_ = *(undefined8 *)&ppVar1->second;
    local_40.sa_data._6_8_ = *(undefined8 *)(ppVar1->second).sin_zero;
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
    ::pop_front(&(this->msg_queue).c);
    sVar3 = sendto((this->super_Subscriber).fd,local_60,local_58,0,&local_40,0x10);
    if (local_58 != sVar3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"UDPServer: error in writing to udp socket ",0x2a);
      from_errno_abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_80,local_78);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
    }
    if ((this->msg_queue).c.
        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->msg_queue).c.
        super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      Subscriber::set_expected(&this->super_Subscriber,1);
      Poll::notify_subscriber_changed(p,&this->super_Subscriber);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    return;
  }
  Subscriber::set_expected(&this->super_Subscriber,1);
  Poll::notify_subscriber_changed(p,&this->super_Subscriber);
  return;
}

Assistant:

void UDPServer::on_output(Poll &p) {
  if (msg_queue.empty()) {
    set_expected(POLLIN);
    p.notify_subscriber_changed(*this);
    return;
  }
  auto msg = msg_queue.front();
  msg_queue.pop();
  socklen_t len = sizeof(msg.second);
  if (msg.first.size() != sendto(fd, &msg.first[0], msg.first.size(), 0, (struct sockaddr *) &msg.second, len)) {
    std::cout << "UDPServer: error in writing to udp socket " << from_errno() << std::endl;
  }
  if (msg_queue.empty()) {
    set_expected(POLLIN);
    p.notify_subscriber_changed(*this);
  }
}